

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

upb_MapInsertStatus
upb_Map_Insert(upb_Map *map,upb_MessageValue key,upb_MessageValue val,upb_Arena *arena)

{
  upb_Map_Table *t;
  char cVar1;
  uintptr_t key_00;
  _Bool _Var2;
  _Bool _Var3;
  upb_MapInsertStatus uVar4;
  double *pdVar5;
  size_t len;
  char ******key_01;
  uintptr_t intkey;
  upb_value local_58;
  char *****local_50;
  size_t local_48;
  double local_40;
  double dStack_38;
  uintptr_t local_30;
  
  dStack_38 = (double)val.str_val.size;
  local_40 = val.double_val;
  local_48 = key.str_val.size;
  local_50 = (char *****)key.str_val.data;
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                  ,0x46,
                  "upb_MapInsertStatus upb_Map_Insert(upb_Map *, upb_MessageValue, upb_MessageValue, upb_Arena *)"
                 );
  }
  if (map->is_frozen_dont_copy_me__upb_internal_use_only == true) {
    __assert_fail("!upb_Map_IsFrozen(map)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/map.h"
                  ,0xb0,
                  "upb_MapInsertStatus _upb_Map_Insert(struct upb_Map *, const void *, size_t, void *, size_t, upb_Arena *)"
                 );
  }
  cVar1 = map->key_size;
  local_58.val = 0;
  if (map->val_size == '\0') {
    pdVar5 = (double *)arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)pdVar5) < 0x10) {
      pdVar5 = (double *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x10);
    }
    else {
      if ((double *)((ulong)((long)pdVar5 + 7U) & 0xfffffffffffffff8) != pdVar5) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(pdVar5 + 2);
    }
    if (pdVar5 == (double *)0x0) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
    *pdVar5 = local_40;
    pdVar5[1] = dStack_38;
    local_58.val = (uint64_t)pdVar5;
  }
  else {
    memcpy(&local_58,&local_40,(long)map->val_size);
  }
  t = &map->t;
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    len = local_48;
    key_01 = (char ******)local_50;
    if (cVar1 != '\0') {
      len = (long)cVar1;
      key_01 = &local_50;
    }
    _Var2 = upb_strtable_remove2(&t->strtable,(char *)key_01,len,(upb_value *)0x0);
    _Var3 = upb_strtable_insert(&t->strtable,(char *)key_01,len,local_58,arena);
  }
  else {
    local_30 = 0;
    memcpy(&local_30,&local_50,(long)cVar1);
    key_00 = local_30;
    _Var2 = upb_inttable_remove(&t->inttable,local_30,(upb_value *)0x0);
    _Var3 = upb_inttable_insert(&t->inttable,key_00,local_58,arena);
  }
  uVar4 = kUpb_MapInsertStatus_OutOfMemory;
  if (_Var3 != false) {
    uVar4 = (upb_MapInsertStatus)_Var2;
  }
  return uVar4;
}

Assistant:

upb_MapInsertStatus upb_Map_Insert(upb_Map* map, upb_MessageValue key,
                                   upb_MessageValue val, upb_Arena* arena) {
  UPB_ASSERT(arena);
  return (upb_MapInsertStatus)_upb_Map_Insert(map, &key, map->key_size, &val,
                                              map->val_size, arena);
}